

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O0

uint64_t __thiscall nivalis::Environment::addr_of_func(Environment *this,string *func_name)

{
  bool bVar1;
  pointer ppVar2;
  const_iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20 [3];
  unsigned_long local_8;
  
  std::__cxx11::string::clear();
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::find(in_stack_ffffffffffffffc8,(key_type *)0x111527);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = std::operator!=(local_20,&local_28);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                           *)0x111561);
    local_8 = ppVar2->second;
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

uint64_t Environment::addr_of_func(const std::string& func_name) const {
    error_msg.clear();
    auto it = freg.find(func_name);
    if (it != freg.end()) {
        return it->second;
    }
    return -1;
}